

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_sockets.c
# Opt level: O1

int mbedtls_net_recv_timeout(void *ctx,uchar *buf,size_t len,uint32_t timeout)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  timeval *__timeout;
  undefined1 auStack_b8 [8];
  fd_set read_fds;
  undefined1 local_30 [8];
  timeval tv;
  
  iVar1 = *ctx;
  iVar4 = -0x47;
  if (iVar1 < 0x400) {
    iVar4 = 0;
  }
  iVar2 = -0x45;
  if (-1 < iVar1) {
    iVar2 = iVar4;
  }
  if (iVar2 == 0) {
    read_fds.fds_bits[0xd] = 0;
    read_fds.fds_bits[0xe] = 0;
    read_fds.fds_bits[0xb] = 0;
    read_fds.fds_bits[0xc] = 0;
    read_fds.fds_bits[9] = 0;
    read_fds.fds_bits[10] = 0;
    read_fds.fds_bits[7] = 0;
    read_fds.fds_bits[8] = 0;
    read_fds.fds_bits[5] = 0;
    read_fds.fds_bits[6] = 0;
    read_fds.fds_bits[3] = 0;
    read_fds.fds_bits[4] = 0;
    read_fds.fds_bits[1] = 0;
    read_fds.fds_bits[2] = 0;
    auStack_b8 = (undefined1  [8])0x0;
    read_fds.fds_bits[0] = 0;
    iVar4 = iVar1 + 0x3f;
    if (-1 < iVar1) {
      iVar4 = iVar1;
    }
    read_fds.fds_bits[(long)(iVar4 >> 6) + -1] =
         read_fds.fds_bits[(long)(iVar4 >> 6) + -1] | 1L << ((byte)iVar1 & 0x3f);
    local_30 = (undefined1  [8])((ulong)timeout / 1000);
    tv.tv_sec = (__time_t)((timeout % 1000) * 1000);
    __timeout = (timeval *)local_30;
    if (timeout == 0) {
      __timeout = (timeval *)0x0;
    }
    iVar1 = select(iVar1 + 1,(fd_set *)auStack_b8,(fd_set *)0x0,(fd_set *)0x0,__timeout);
    if (iVar1 == 0) {
      iVar2 = -0x6800;
    }
    else if (iVar1 < 0) {
      piVar3 = __errno_location();
      iVar2 = -0x4c;
      if (*piVar3 == 4) {
        iVar2 = -0x6900;
      }
    }
    else {
      iVar2 = mbedtls_net_recv(ctx,buf,len);
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_net_recv_timeout(void *ctx, unsigned char *buf,
                             size_t len, uint32_t timeout)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    struct timeval tv;
    fd_set read_fds;
    int fd = ((mbedtls_net_context *) ctx)->fd;

    ret = check_fd(fd, 1);
    if (ret != 0) {
        return ret;
    }

    FD_ZERO(&read_fds);
    FD_SET((SOCKET) fd, &read_fds);

    tv.tv_sec  = timeout / 1000;
    tv.tv_usec = (timeout % 1000) * 1000;

    ret = select(fd + 1, &read_fds, NULL, NULL, timeout == 0 ? NULL : &tv);

    /* Zero fds ready means we timed out */
    if (ret == 0) {
        return MBEDTLS_ERR_SSL_TIMEOUT;
    }

    if (ret < 0) {
#if (defined(_WIN32) || defined(_WIN32_WCE)) && !defined(EFIX64) && \
        !defined(EFI32)
        if (WSAGetLastError() == WSAEINTR) {
            return MBEDTLS_ERR_SSL_WANT_READ;
        }
#else
        if (errno == EINTR) {
            return MBEDTLS_ERR_SSL_WANT_READ;
        }
#endif

        return MBEDTLS_ERR_NET_RECV_FAILED;
    }

    /* This call will not block */
    return mbedtls_net_recv(ctx, buf, len);
}